

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgreen-runner.c
# Opt level: O0

_Bool run_tests_in_library
                (char *suite_name_option,char *test_name,char *test_library,_Bool verbose,
                _Bool no_run)

{
  int iVar1;
  char *__ptr;
  undefined1 in_CL;
  char *in_RDX;
  undefined1 in_R8B;
  char *suite_name;
  int status;
  char *in_stack_00000028;
  char *in_stack_00000030;
  TestReporter *in_stack_00000038;
  undefined4 in_stack_ffffffffffffffe0;
  undefined2 in_stack_ffffffffffffffe4;
  
  __ptr = get_a_suite_name(in_RDX,(char *)(CONCAT17(in_CL,CONCAT16(in_R8B,CONCAT24(
                                                  in_stack_ffffffffffffffe4,
                                                  in_stack_ffffffffffffffe0))) & 0x101ffffffffffff))
  ;
  iVar1 = runner(in_stack_00000038,in_stack_00000030,in_stack_00000028,suite_name_option,
                 test_name._7_1_,test_name._6_1_);
  free(__ptr);
  return iVar1 != 0;
}

Assistant:

static bool run_tests_in_library(const char *suite_name_option, const char *test_name,
                                 const char *test_library, bool verbose, bool no_run) {
    int status;
    char *suite_name;

    suite_name = get_a_suite_name(suite_name_option, test_library);

    status = runner(reporter, test_library, suite_name, test_name, verbose, no_run);
    free((void*)suite_name);

    return status != 0;
}